

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigRetMin.c
# Opt level: O1

int Saig_ManHideBadRegs(Aig_Man_t *p,Vec_Ptr_t *vBadRegs)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  void *pvVar3;
  int iVar4;
  Vec_Ptr_t *pVVar5;
  void **ppvVar6;
  Vec_Ptr_t *pVVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  
  if (vBadRegs->nSize == 0) {
    iVar9 = 0;
  }
  else {
    iVar9 = p->nRegs;
    if (0 < iVar9) {
      iVar4 = 0;
      do {
        uVar8 = p->nTruePos + iVar4;
        if (((((int)uVar8 < 0) || (p->vCos->nSize <= (int)uVar8)) ||
            (uVar10 = p->nTruePis + iVar4, (int)uVar10 < 0)) || (p->vCis->nSize <= (int)uVar10))
        goto LAB_006e8fa0;
        *(void **)((long)p->vCos->pArray[uVar8] + 0x28) = p->vCis->pArray[uVar10];
        iVar4 = iVar4 + 1;
        iVar9 = p->nRegs;
      } while (iVar4 < iVar9);
    }
    pVVar2 = p->vCis;
    pVVar5 = (Vec_Ptr_t *)malloc(0x10);
    iVar4 = pVVar2->nSize;
    pVVar5->nSize = iVar4;
    iVar1 = pVVar2->nCap;
    pVVar5->nCap = iVar1;
    if ((long)iVar1 == 0) {
      ppvVar6 = (void **)0x0;
    }
    else {
      ppvVar6 = (void **)malloc((long)iVar1 << 3);
    }
    pVVar5->pArray = ppvVar6;
    memcpy(ppvVar6,pVVar2->pArray,(long)iVar4 << 3);
    pVVar2 = p->vCos;
    pVVar7 = (Vec_Ptr_t *)malloc(0x10);
    iVar4 = pVVar2->nSize;
    pVVar7->nSize = iVar4;
    iVar1 = pVVar2->nCap;
    pVVar7->nCap = iVar1;
    if ((long)iVar1 == 0) {
      ppvVar6 = (void **)0x0;
    }
    else {
      ppvVar6 = (void **)malloc((long)iVar1 << 3);
    }
    pVVar7->pArray = ppvVar6;
    memcpy(ppvVar6,pVVar2->pArray,(long)iVar4 << 3);
    uVar8 = p->nObjs[2] - iVar9;
    if (uVar8 != p->nTruePis) {
      __assert_fail("nTruePi == p->nTruePis",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigRetMin.c"
                    ,0x1fa,"int Saig_ManHideBadRegs(Aig_Man_t *, Vec_Ptr_t *)");
    }
    uVar10 = p->nObjs[3] - iVar9;
    if (uVar10 != p->nTruePos) {
      __assert_fail("nTruePo == p->nTruePos",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigRetMin.c"
                    ,0x1fb,"int Saig_ManHideBadRegs(Aig_Man_t *, Vec_Ptr_t *)");
    }
    if (0 < vBadRegs->nSize) {
      lVar13 = 0;
      do {
        if (((int)uVar8 < 0) || (pVVar5->nSize <= (int)(uVar8 + (int)lVar13))) goto LAB_006e8fbf;
        pvVar3 = vBadRegs->pArray[lVar13];
        pVVar5->pArray[(ulong)uVar8 + lVar13] = *(void **)((long)pvVar3 + 0x28);
        if (((int)uVar10 < 0) || (pVVar7->nSize <= (int)(uVar10 + (int)lVar13))) goto LAB_006e8fbf;
        pVVar7->pArray[(ulong)uVar10 + lVar13] = pvVar3;
        *(byte *)((long)pvVar3 + 0x18) = *(byte *)((long)pvVar3 + 0x18) | 0x10;
        lVar13 = lVar13 + 1;
      } while (lVar13 < vBadRegs->nSize);
      uVar8 = uVar8 + (int)lVar13;
      uVar10 = uVar10 + (int)lVar13;
    }
    if (0 < p->nRegs) {
      iVar9 = 0;
      do {
        uVar11 = p->nTruePos + iVar9;
        if ((((int)uVar11 < 0) || (p->vCos->nSize <= (int)uVar11)) ||
           ((uVar12 = p->nTruePis + iVar9, (int)uVar12 < 0 || (p->vCis->nSize <= (int)uVar12)))) {
LAB_006e8fa0:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pvVar3 = p->vCos->pArray[uVar11];
        if ((*(ulong *)((long)pvVar3 + 0x18) & 0x10) == 0) {
          if (((((int)uVar8 < 0) || (pVVar5->nSize <= (int)uVar8)) ||
              (pVVar5->pArray[uVar8] = p->vCis->pArray[uVar12], (int)uVar10 < 0)) ||
             (pVVar7->nSize <= (int)uVar10)) {
LAB_006e8fbf:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                          ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
          }
          uVar8 = uVar8 + 1;
          uVar14 = (ulong)uVar10;
          uVar10 = uVar10 + 1;
          pVVar7->pArray[uVar14] = pvVar3;
        }
        else {
          *(ulong *)((long)pvVar3 + 0x18) = *(ulong *)((long)pvVar3 + 0x18) & 0xffffffffffffffef;
        }
        iVar9 = iVar9 + 1;
      } while (iVar9 < p->nRegs);
    }
    if (uVar8 != p->nObjs[2]) {
      __assert_fail("nTruePi == Aig_ManCiNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigRetMin.c"
                    ,0x20d,"int Saig_ManHideBadRegs(Aig_Man_t *, Vec_Ptr_t *)");
    }
    if (uVar10 != p->nObjs[3]) {
      __assert_fail("nTruePo == Aig_ManCoNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigRetMin.c"
                    ,0x20e,"int Saig_ManHideBadRegs(Aig_Man_t *, Vec_Ptr_t *)");
    }
    pVVar2 = p->vCis;
    if (pVVar2->pArray != (void **)0x0) {
      free(pVVar2->pArray);
      pVVar2->pArray = (void **)0x0;
    }
    if (pVVar2 != (Vec_Ptr_t *)0x0) {
      free(pVVar2);
    }
    p->vCis = pVVar5;
    pVVar2 = p->vCos;
    if (pVVar2->pArray != (void **)0x0) {
      free(pVVar2->pArray);
      pVVar2->pArray = (void **)0x0;
    }
    if (pVVar2 != (Vec_Ptr_t *)0x0) {
      free(pVVar2);
    }
    p->vCos = pVVar7;
    iVar9 = vBadRegs->nSize;
    p->nRegs = p->nRegs - iVar9;
    p->nTruePis = p->nTruePis + iVar9;
    p->nTruePos = p->nTruePos + iVar9;
  }
  return iVar9;
}

Assistant:

int Saig_ManHideBadRegs( Aig_Man_t * p, Vec_Ptr_t * vBadRegs )
{
    Vec_Ptr_t * vPisNew, * vPosNew;
    Aig_Obj_t * pObjLi, * pObjLo;
    int nTruePi, nTruePo, nBadRegs, i;
    if ( Vec_PtrSize(vBadRegs) == 0 )
        return 0;
    // attached LOs to LIs
    Saig_ManForEachLiLo( p, pObjLi, pObjLo, i )
        pObjLi->pData = pObjLo;
    // reorder them by putting bad registers first
    vPisNew = Vec_PtrDup( p->vCis );
    vPosNew = Vec_PtrDup( p->vCos );
    nTruePi = Aig_ManCiNum(p) - Aig_ManRegNum(p);
    nTruePo = Aig_ManCoNum(p) - Aig_ManRegNum(p);
    assert( nTruePi == p->nTruePis );
    assert( nTruePo == p->nTruePos );
    Vec_PtrForEachEntry( Aig_Obj_t *, vBadRegs, pObjLi, i )
    {
        Vec_PtrWriteEntry( vPisNew, nTruePi++, pObjLi->pData );
        Vec_PtrWriteEntry( vPosNew, nTruePo++, pObjLi );
        pObjLi->fMarkA = 1;
    }
    Saig_ManForEachLiLo( p, pObjLi, pObjLo, i )
    {
        if ( pObjLi->fMarkA )
        {
            pObjLi->fMarkA = 0;
            continue;
        }
        Vec_PtrWriteEntry( vPisNew, nTruePi++, pObjLo );
        Vec_PtrWriteEntry( vPosNew, nTruePo++, pObjLi );
    }
    // check the sizes
    assert( nTruePi == Aig_ManCiNum(p) );
    assert( nTruePo == Aig_ManCoNum(p) );
    // transfer the arrays
    Vec_PtrFree( p->vCis ); p->vCis = vPisNew;
    Vec_PtrFree( p->vCos ); p->vCos = vPosNew;
    // update the PIs
    nBadRegs = Vec_PtrSize(vBadRegs);
    p->nRegs -= nBadRegs;
    p->nTruePis += nBadRegs;
    p->nTruePos += nBadRegs;
    return nBadRegs;
}